

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

ssize_t __thiscall
QTextStreamPrivate::write(QTextStreamPrivate *this,int __fd,void *__buf,size_t __n)

{
  QString *pQVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  QLatin1StringView str;
  QLatin1StringView str_00;
  
  str.m_size = CONCAT44(in_register_00000034,__fd);
  if (this->string != (QString *)0x0) {
    str.m_data = (char *)__buf;
    pQVar1 = QString::append(this->string,str);
    return (ssize_t)pQVar1;
  }
  str_00.m_data = (char *)__buf;
  str_00.m_size = str.m_size;
  pQVar1 = QString::append(&this->writeBuffer,str_00);
  if (0x4000 < (ulong)(this->writeBuffer).d.size) {
    flushWriteBuffer(this);
    return extraout_RAX;
  }
  return (ssize_t)pQVar1;
}

Assistant:

void QTextStreamPrivate::write(QLatin1StringView data)
{
    if (string) {
        // ### What about seek()??
        string->append(data);
    } else {
        writeBuffer += data;
        if (writeBuffer.size() > QTEXTSTREAM_BUFFERSIZE)
            flushWriteBuffer();
    }
}